

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::getp_substr(vm_val_t *retval,vm_val_t *self_val,char *str,uint *in_argc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  vm_obj_id_t vVar7;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  byte *bytelen;
  byte *pbVar11;
  byte *str_00;
  byte *pbVar12;
  bool bVar13;
  
  if (in_argc == (uint *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = 1 < *in_argc;
  }
  if (getp_substr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_substr();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_substr::desc);
  if (iVar4 == 0) {
    iVar5 = CVmBif::pop_long_val();
    if (bVar13) {
      iVar6 = CVmBif::pop_long_val();
      uVar8 = (ulong)iVar6;
    }
    else {
      uVar8 = 0;
    }
    pvVar3 = sp_;
    lVar9 = (long)iVar5;
    uVar2 = *(undefined4 *)&self_val->field_0x4;
    aVar1 = self_val->val;
    sp_ = sp_ + 1;
    pvVar3->typ = self_val->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    str_00 = (byte *)(str + 2);
    bytelen = (byte *)(ulong)*(ushort *)str;
    if (iVar5 < 1) {
      if (iVar5 < 0) {
        str_00 = (byte *)(str + (long)(bytelen + 2));
        if (bytelen == (byte *)0x0) {
          bytelen = (byte *)0x0;
        }
        else {
          pbVar11 = bytelen + 2;
          bytelen = (byte *)0x0;
          pbVar10 = str_00;
          do {
            pbVar11 = pbVar11 + (-1 - (ulong)(~(uint)((byte)str[(long)(pbVar11 + -1)] >> 6) &
                                             (uint)((byte)str[(long)(pbVar11 + -1)] >> 7))) +
                      -(ulong)(~(uint)((byte)str[(long)(pbVar11 +
                                                       (-1 - (ulong)(~(uint)((byte)str[(long)(
                                                  pbVar11 + -1)] >> 6) &
                                                  (uint)((byte)str[(long)(pbVar11 + -1)] >> 7))))]
                                      >> 6) &
                              (uint)((byte)str[(long)(pbVar11 +
                                                     (-1 - (ulong)(~(uint)((byte)str[(long)(pbVar11 
                                                  + -1)] >> 6) &
                                                  (uint)((byte)str[(long)(pbVar11 + -1)] >> 7))))]
                                    >> 7));
            str_00 = (byte *)(str + (long)pbVar11);
            bytelen = pbVar10 + ((long)bytelen - (long)str_00);
            if (-2 < lVar9) break;
            lVar9 = lVar9 + 1;
            pbVar10 = str_00;
          } while (pbVar11 != (byte *)0x2);
        }
      }
    }
    else {
      pbVar10 = str_00;
      if (*(ushort *)str != 0 && iVar5 != 1) {
        do {
          str_00 = pbVar10 + (ulong)(((*pbVar10 >> 5 & 1) != 0) + 1 & (uint)(*pbVar10 >> 7) * 3) + 1
          ;
          bytelen = pbVar10 + ((long)bytelen - (long)str_00);
          if (lVar9 < 3) break;
          lVar9 = lVar9 + -1;
          pbVar10 = str_00;
        } while (bytelen != (byte *)0x0);
      }
    }
    if (bVar13) {
      if ((long)uVar8 < 0) {
        if (bytelen == (byte *)0x0) {
          pbVar10 = (byte *)0x0;
        }
        else {
          pbVar10 = (byte *)0x0;
          pbVar11 = str_00 + (long)bytelen;
          do {
            uVar8 = uVar8 + 1;
            pbVar12 = pbVar11 + (-1 - (ulong)(~(uint)(pbVar11[-1] >> 6) & (uint)(pbVar11[-1] >> 7)))
            ;
            pbVar10 = pbVar11 + ((long)pbVar10 -
                                (long)(pbVar12 +
                                      -(ulong)(~(uint)(*pbVar12 >> 6) & (uint)(*pbVar12 >> 7))));
            if (uVar8 == 0) break;
            pbVar11 = pbVar12 + -(ulong)(~(uint)(*pbVar12 >> 6) & (uint)(*pbVar12 >> 7));
          } while (pbVar10 < bytelen);
        }
      }
      else {
        pbVar10 = bytelen;
        pbVar11 = str_00;
        if (uVar8 != 0) {
          while (pbVar10 != (byte *)0x0) {
            pbVar10 = pbVar11 + ((long)pbVar10 -
                                (long)(pbVar11 +
                                      (ulong)(((*pbVar11 >> 5 & 1) != 0) + 1 &
                                             (uint)(*pbVar11 >> 7) * 3) + 1));
            if (uVar8 < 2) break;
            uVar8 = uVar8 - 1;
            pbVar11 = pbVar11 + (ulong)(((*pbVar11 >> 5 & 1) != 0) + 1 & (uint)(*pbVar11 >> 7) * 3)
                                + 1;
          }
        }
      }
      bytelen = bytelen + -(long)pbVar10;
    }
    vVar7 = create(0,(char *)str_00,(size_t)bytelen);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_substr(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                              const char *str, uint *in_argc)
{
    long start;
    long len = 0;
    size_t rem;
    utf8_ptr p;
    utf8_ptr start_p;
    size_t start_rem;
    size_t new_len;
    vm_obj_id_t obj;

    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* pop the starting index */
    start = CVmBif::pop_long_val(vmg0_);

    /* pop the length, if present */
    if (argc >= 2)
        len = CVmBif::pop_long_val(vmg0_);

    /* push a self-reference to protect against GC */
    G_stk->push(self_val);

    /* set up a utf8 pointer to traverse the string */
    p.set((char *)str + VMB_LEN);

    /* get the byte length of the string */
    rem = vmb_get_len(str);

    /* 
     *   Skip ahead to the starting index.  If the index is positive, it's
     *   an index from the start of the string; if it's negative, it's an
     *   offset from the end of the string.  
     */
    if (start > 0)
    {
        /* 
         *   it's an index from the start - skip ahead by start-1 characters
         *   (since a start value of 1 tells us to start at the first
         *   character) 
         */
        for ( ; start > 1 && rem != 0 ; --start)
            p.inc(&rem);
    }
    else if (start < 0)
    {
        /*
         *   It's an index from the end of the string: -1 tells us to start
         *   at the last character, -2 at the second to last, and so on.
         *   Move to the first byte past the end of the string, and work
         *   backwards by the given number of characters.  
         */
        for (p.set((char *)str + VMB_LEN + rem), rem = 0 ;
             start < 0 && p.getptr() != (char *)str + VMB_LEN ; ++start)
        {
            /* move back one character */
            p.dec(&rem);
        }
    }

    /* this is the starting position */
    start_p = p;
    start_rem = rem;

    /* 
     *   if a length was specified, calculate the number of bytes in the
     *   given length; otherwise, use the entire remainder of the string 
     */
    if (argc >= 2)
    {
        /* figure the positive or negative length */
        if (len >= 0)
        {
            /* 
             *   Positive length - this specifies the number of characters to
             *   keep starting at the starting index.  Skip ahead by the
             *   desired length to figure the end pointer. 
             */
            for ( ; len > 0 && rem != 0 ; --len)
                p.inc(&rem);
        }
        else
        {
            /*
             *   Negative length - this specifies the number of characters to
             *   remove from the end of the string.  Move to the end of the
             *   string, then skip back by |len| characters to find the end
             *   pointer.  
             */
            for (p.set(p.getptr() + rem), rem = 0 ;
                 len < 0 && rem < start_rem ; ++len)
                 p.dec(&rem);
        }

        /* use the difference in lengths from the starting point to here */
        new_len = start_rem - rem;
    }
    else
    {
        /* use the entire remainder of the string */
        new_len = start_rem;
    }

    /* create the new string */
    obj = CVmObjString::create(vmg_ FALSE, start_p.getptr(), new_len);

    /* return the new object */
    retval->set_obj(obj);

    /* discard the GC protection references */
    G_stk->discard();

    /* handled */
    return TRUE;
}